

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O1

bool __thiscall Nova::Arg_Data::Parse_Value(Arg_Data *this,int argc,char **argv,int *current_arg)

{
  char *__s;
  char *pcVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  switch(this->type) {
  case OPTION:
    this->boolean_value = true;
    iVar3 = *current_arg + 1;
    break;
  case INTEGER:
    if (argc <= *current_arg + 1) {
      return false;
    }
    iVar3 = atoi(argv[(long)*current_arg + 1]);
    this->integer_value = iVar3;
    goto LAB_0012602b;
  case DOUBLE:
    iVar3 = *current_arg;
    if (argc <= iVar3 + 1) {
      return false;
    }
    dVar4 = atof(argv[(long)iVar3 + 1]);
    this->double_value = dVar4;
    iVar3 = iVar3 + 2;
    break;
  case VECTOR2:
    iVar3 = *current_arg;
    if (argc <= iVar3 + 2) {
      return false;
    }
    lVar2 = 0;
    do {
      dVar4 = atof(argv[(long)iVar3 + lVar2 + 1]);
      (this->vector_2d_value)._data._M_elems[lVar2] = dVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    iVar3 = iVar3 + 3;
    break;
  case VECTOR3:
    iVar3 = *current_arg;
    if (argc <= iVar3 + 3) {
      return false;
    }
    lVar2 = 0;
    do {
      dVar4 = atof(argv[(long)iVar3 + lVar2 + 1]);
      (this->vector_3d_value)._data._M_elems[lVar2] = dVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    iVar3 = iVar3 + 4;
    break;
  case STRING:
    if (argc <= *current_arg + 1) {
      return false;
    }
    __s = argv[(long)*current_arg + 1];
    pcVar1 = (char *)(this->string_value)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->string_value,0,pcVar1,(ulong)__s);
LAB_0012602b:
    iVar3 = *current_arg + 2;
    break;
  default:
    return false;
  }
  *current_arg = iVar3;
  return true;
}

Assistant:

bool Parse_Value(int argc,char* argv[],int& current_arg)
    {
        switch(type)
        {
            case OPTION:    boolean_value=true;
                            current_arg++;
                            return true;

            case INTEGER:   if(current_arg+1<argc)
                            {
                                integer_value=atoi(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case DOUBLE:    if(current_arg+1<argc)
                            {
                                double_value=atof(argv[current_arg+1]);
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            case VECTOR2:   if(current_arg+2<argc)
                            {
                                for(int i=0;i<=1;i++) vector_2d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=3;
                                return true;
                            }
                            else return false;

            case VECTOR3:   if(current_arg+3<argc)
                            {
                                for(int i=0;i<=2;i++) vector_3d_value[i]=atof(argv[current_arg+i+1]);
                                current_arg+=4;
                                return true;
                            }
                            else return false;

            case STRING:    if(current_arg+1<argc)
                            {
                                string_value=argv[current_arg+1];
                                current_arg+=2;
                                return true;
                            }
                            else return false;

            default:        return false;
        }

        return false;
    }